

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

void __thiscall
wasm::OptimizeInstructions::skipCast
          (OptimizeInstructions *this,Expression **input,Type requiredType)

{
  Expression *pEVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  
  if ((((this->
        super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
        ).super_Pass.runner)->options).trapsNeverHappen == true) {
    do {
      pEVar1 = *input;
      bVar2 = false;
      bVar3 = true;
      if (pEVar1->_id == RefCastId) {
        if ((requiredType.id == 0) ||
           (bVar4 = wasm::Type::isSubType
                              ((Type)*(uintptr_t *)(*(long *)(pEVar1 + 1) + 8),requiredType), bVar4)
           ) {
          *input = *(Expression **)(pEVar1 + 1);
          bVar2 = true;
          bVar3 = false;
        }
LAB_008118b5:
        if (bVar3) {
LAB_008118ba:
          bVar2 = false;
        }
      }
      else {
        if (pEVar1->_id != RefAsId) goto LAB_008118b5;
        if ((requiredType.id != 0) &&
           (bVar3 = wasm::Type::isSubType((Type)*(uintptr_t *)(pEVar1[1].type.id + 8),requiredType),
           !bVar3)) goto LAB_008118ba;
        *input = (Expression *)pEVar1[1].type.id;
        bVar2 = true;
      }
    } while (bVar2);
  }
  return;
}

Assistant:

void skipCast(Expression*& input, Type requiredType = Type::none) {
    // Traps-never-happen mode is a requirement for us to optimize here.
    if (!getPassOptions().trapsNeverHappen) {
      return;
    }
    while (1) {
      if (auto* as = input->dynCast<RefAs>()) {
        if (requiredType == Type::none ||
            Type::isSubType(as->value->type, requiredType)) {
          input = as->value;
          continue;
        }
      } else if (auto* cast = input->dynCast<RefCast>()) {
        if (requiredType == Type::none ||
            Type::isSubType(cast->ref->type, requiredType)) {
          input = cast->ref;
          continue;
        }
      }
      break;
    }
  }